

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomTargetCommand.cxx
# Opt level: O2

bool cmAddCustomTargetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  cmMakefile *this;
  pointer pbVar1;
  __single_object _Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  long lVar7;
  undefined7 extraout_var;
  size_type sVar8;
  string *a;
  cmTarget *this_00;
  char *extraout_RDX;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string_view value;
  undefined8 uStack_210;
  char local_201;
  __single_object cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  ulong local_1e0;
  cmCustomCommandLine currentLine;
  cmCustomCommandLines commandLines;
  char *local_198;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_180;
  string working_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_f8;
  string job_server_aware;
  string job_pool;
  string comment_buffer;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  input = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (input == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&working_directory,"called with incorrect number of arguments",
               (allocator<char> *)&comment_buffer);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    this = status->Makefile;
    lVar7 = std::__cxx11::string::find_first_of((char *)input,0x745d08);
    if (lVar7 == -1) {
      currentLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      currentLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      currentLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      working_directory._M_dataplus._M_p = (pointer)&working_directory.field_2;
      working_directory._M_string_length = 0;
      byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      uStack_210 = 0;
      working_directory.field_2._M_local_buf[0] = '\0';
      comment_buffer._M_dataplus._M_p = (pointer)&comment_buffer.field_2;
      comment_buffer._M_string_length = 0;
      sources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      job_pool._M_dataplus._M_p = (pointer)&job_pool.field_2;
      job_pool._M_string_length = 0;
      comment_buffer.field_2._M_local_buf[0] = '\0';
      sources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      job_pool.field_2._M_local_buf[0] = '\0';
      job_server_aware._M_dataplus._M_p = (pointer)&job_server_aware.field_2;
      job_server_aware._M_string_length = 0;
      job_server_aware.field_2._M_local_buf[0] = '\0';
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar4 = true;
      uVar9 = 1;
      if (0x20 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) {
        bVar3 = std::operator==(pbVar1 + 1,"ALL");
        bVar4 = !bVar3;
        uVar9 = (ulong)(bVar3 + 1);
      }
      local_1e0 = 0;
      bVar3 = false;
      local_198 = (char *)0x0;
      bVar6 = 0;
LAB_003173d5:
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar9)
      goto LAB_00317714;
      __lhs = pbVar1 + uVar9;
      bVar5 = std::operator==(__lhs,"DEPENDS");
      if (bVar5) {
LAB_00317408:
        uStack_210 = 1;
      }
      else {
        bVar5 = std::operator==(__lhs,"BYPRODUCTS");
        if (bVar5) {
LAB_00317422:
          uStack_210 = 2;
        }
        else {
          bVar5 = std::operator==(__lhs,"WORKING_DIRECTORY");
          if (bVar5) {
            uStack_210 = 3;
          }
          else {
            bVar5 = std::operator==(__lhs,"VERBATIM");
            if (bVar5) {
              uStack_210 = 8;
              bVar6 = 1;
            }
            else {
              bVar5 = std::operator==(__lhs,"USES_TERMINAL");
              if (bVar5) {
                local_1e0 = CONCAT71(extraout_var,1);
              }
              else {
                bVar5 = std::operator==(__lhs,"COMMAND_EXPAND_LISTS");
                if (!bVar5) {
                  bVar5 = std::operator==(__lhs,"COMMENT");
                  if (bVar5) {
LAB_003174b8:
                    uStack_210 = 4;
                  }
                  else {
                    bVar5 = std::operator==(__lhs,"JOB_POOL");
                    if (bVar5) {
                      uStack_210 = 6;
                    }
                    else {
                      bVar5 = std::operator==(__lhs,"JOB_SERVER_AWARE");
                      if (bVar5) {
                        uStack_210 = 7;
                      }
                      else {
                        bVar5 = std::operator==(__lhs,"COMMAND");
                        if (bVar5) {
                          uStack_210 = 0;
                          if (currentLine.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start !=
                              currentLine.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish) {
                            std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
                            push_back(&commandLines.
                                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                      ,&currentLine);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::clear(&currentLine.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   );
                          }
                        }
                        else {
                          bVar5 = std::operator==(__lhs,"SOURCES");
                          if (bVar5) {
                            uStack_210 = 5;
                          }
                          else {
                            switch(uStack_210) {
                            case 0:
                              uStack_210 = 0;
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back(&currentLine.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ,__lhs);
                              break;
                            case 1:
                              std::__cxx11::string::string((string *)&cc,(string *)__lhs);
                              cmsys::SystemTools::ConvertToUnixSlashes((string *)&cc);
                              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                              ::emplace_back<std::__cxx11::string>
                                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                          *)&depends,(string *)&cc);
                              std::__cxx11::string::~string((string *)&cc);
                              goto LAB_00317408;
                            case 2:
                              cc._M_t.
                              super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                              .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
                                   (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>
                                    )&local_1f0;
                              local_1f0._M_local_buf[0] = '\0';
                              bVar5 = cmsys::SystemTools::FileIsFullPath(__lhs);
                              if ((!bVar5) &&
                                 (sVar8 = cmGeneratorExpression::Find(__lhs), sVar8 != 0)) {
                                a = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
                                local_201 = '/';
                                cmStrCat<std::__cxx11::string_const&,char>(&local_f8,a,&local_201);
                                std::__cxx11::string::operator=((string *)&cc,(string *)&local_f8);
                                std::__cxx11::string::~string((string *)&local_f8);
                              }
                              std::__cxx11::string::append((string *)&cc);
                              cmsys::SystemTools::ConvertToUnixSlashes((string *)&cc);
                              bVar5 = cmsys::SystemTools::FileIsFullPath((string *)&cc);
                              if (bVar5) {
                                cmsys::SystemTools::CollapseFullPath(&local_f8,(string *)&cc);
                                std::__cxx11::string::operator=((string *)&cc,(string *)&local_f8);
                                std::__cxx11::string::~string((string *)&local_f8);
                              }
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back(&byproducts,(value_type *)&cc);
                              std::__cxx11::string::~string((string *)&cc);
                              goto LAB_00317422;
                            case 3:
                              std::__cxx11::string::_M_assign((string *)&working_directory);
                              uStack_210 = 3;
                              break;
                            case 4:
                              std::__cxx11::string::_M_assign((string *)&comment_buffer);
                              local_198 = comment_buffer._M_dataplus._M_p;
                              goto LAB_003174b8;
                            case 5:
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back(&sources,__lhs);
                              uStack_210 = 5;
                              break;
                            case 6:
                              std::__cxx11::string::_M_assign((string *)&job_pool);
                              uStack_210 = 6;
                              break;
                            case 7:
                              std::__cxx11::string::_M_assign((string *)&job_server_aware);
                              uStack_210 = 7;
                              break;
                            default:
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&cc,"Wrong syntax. Unknown type of argument.",
                                         (allocator<char> *)&local_f8);
                              std::__cxx11::string::_M_assign((string *)&status->Error);
                              goto LAB_00317767;
                            }
                          }
                        }
                      }
                    }
                  }
                  goto LAB_0031749e;
                }
                bVar3 = true;
              }
              uStack_210 = 8;
            }
          }
        }
      }
LAB_0031749e:
      uVar9 = (ulong)((int)uVar9 + 1);
      goto LAB_003173d5;
    }
    cmStrCat<char_const(&)[34],std::__cxx11::string_const&,char_const(&)[85]>
              (&working_directory,(char (*) [34])"called with invalid target name \"",input,
               (char (*) [85])
               "\".  Target names may not contain a slash.  Use ADD_CUSTOM_COMMAND to generate files."
              );
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string((string *)&working_directory);
  return false;
LAB_00317714:
  lVar7 = std::__cxx11::string::find_first_of((char *)input,0x726c26);
  if (lVar7 == -1) {
    bVar5 = cmGeneratorExpression::IsValidTargetName(input);
    if ((((bVar5) && (bVar5 = cmGlobalGenerator::IsReservedTarget(input), !bVar5)) &&
        (lVar7 = std::__cxx11::string::find((char)input,0x3a), lVar7 == -1)) ||
       (bVar5 = cmMakefile::CheckCMP0037(this,input,UTILITY), bVar5)) {
      if (currentLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          currentLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  (&commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                   &currentLine);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&currentLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
      }
      cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
           &local_1f0;
      local_1f0._M_local_buf[0] = '\0';
      bVar5 = cmMakefile::EnforceUniqueName(this,input,(string *)&cc,true);
      if (bVar5) {
        std::__cxx11::string::~string((string *)&cc);
        if (commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
            super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
            super__Vector_impl_data._M_start ==
            commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
            super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if (byproducts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              byproducts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            if ((local_1e0 & 1) == 0) {
              if (!bVar3) {
                local_1e0 = 0;
                goto LAB_003179b5;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&cc,
                         "COMMAND_EXPAND_LISTS may not be specified without any COMMAND",
                         (allocator<char> *)&local_f8);
              cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)&cc);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&cc,"USES_TERMINAL may not be specified without any COMMAND",
                         (allocator<char> *)&local_f8);
              cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)&cc);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&cc,"BYPRODUCTS may not be specified without any COMMAND",
                       (allocator<char> *)&local_f8);
            cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)&cc);
          }
          std::__cxx11::string::~string((string *)&cc);
        }
        else {
          if (((local_1e0 & 1) != 0) && (job_pool._M_string_length != 0)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&cc,"JOB_POOL is shadowed by USES_TERMINAL.",
                       (allocator<char> *)&local_f8);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_00317767;
          }
LAB_003179b5:
          std::make_unique<cmCustomCommand>();
          cmCustomCommand::SetWorkingDirectory
                    ((cmCustomCommand *)
                     cc._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                     working_directory._M_dataplus._M_p);
          _Var2 = cc;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,&byproducts);
          cmCustomCommand::SetByproducts
                    ((cmCustomCommand *)
                     _Var2._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          _Var2 = cc;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_60,&depends);
          cmCustomCommand::SetDepends
                    ((cmCustomCommand *)
                     _Var2._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_60);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_60);
          _Var2 = cc;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_78,
                     &commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
          cmCustomCommand::SetCommandLines
                    ((cmCustomCommand *)
                     _Var2._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                     (cmCustomCommandLines *)&local_78);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_78)
          ;
          cmCustomCommand::SetEscapeOldStyle
                    ((cmCustomCommand *)
                     cc._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                     (bool)(~bVar6 & 1));
          cmCustomCommand::SetComment
                    ((cmCustomCommand *)
                     cc._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,local_198);
          cmCustomCommand::SetUsesTerminal
                    ((cmCustomCommand *)
                     cc._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                     (bool)((byte)local_1e0 & 1));
          cmCustomCommand::SetCommandExpandLists
                    ((cmCustomCommand *)
                     cc._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,bVar3);
          cmCustomCommand::SetJobPool
                    ((cmCustomCommand *)
                     cc._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&job_pool);
          _Var2 = cc;
          value._M_str = extraout_RDX;
          value._M_len = (size_t)job_server_aware._M_dataplus._M_p;
          bVar3 = cmValue::IsOn((cmValue *)job_server_aware._M_string_length,value);
          cmCustomCommand::SetJobserverAware
                    ((cmCustomCommand *)
                     _Var2._M_t.
                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,bVar3);
          local_180._M_t.
          super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
               cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
          cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
          .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
               (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
               (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
          this_00 = cmMakefile::AddUtilityCommand(this,input,bVar4,&local_180);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    (&local_180);
          cmTarget::AddSources(this_00,&sources);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&cc);
        }
        bVar4 = true;
        goto LAB_00317773;
      }
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_00317767;
    }
  }
  else {
    cmStrCat<char_const(&)[39],char_const&,char_const(&)[35]>
              ((string *)&cc,(char (*) [39])"called with target name containing a \"",
               (input->_M_dataplus)._M_p + lVar7,
               (char (*) [35])"\".  This character is not allowed.");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00317767:
    std::__cxx11::string::~string((string *)&cc);
  }
  bVar4 = false;
LAB_00317773:
  std::__cxx11::string::~string((string *)&job_server_aware);
  std::__cxx11::string::~string((string *)&job_pool);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sources);
  std::__cxx11::string::~string((string *)&comment_buffer);
  std::__cxx11::string::~string((string *)&working_directory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  return bVar4;
}

Assistant:

bool cmAddCustomTargetCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  std::string const& targetName = args[0];

  // Check the target name.
  if (targetName.find_first_of("/\\") != std::string::npos) {
    status.SetError(cmStrCat("called with invalid target name \"", targetName,
                             "\".  Target names may not contain a slash.  "
                             "Use ADD_CUSTOM_COMMAND to generate files."));
    return false;
  }

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  // Accumulate dependencies.
  std::vector<std::string> depends;
  std::vector<std::string> byproducts;
  std::string working_directory;
  bool verbatim = false;
  bool uses_terminal = false;
  bool command_expand_lists = false;
  std::string comment_buffer;
  const char* comment = nullptr;
  std::vector<std::string> sources;
  std::string job_pool;
  std::string job_server_aware;

  // Keep track of parser state.
  enum tdoing
  {
    doing_command,
    doing_depends,
    doing_byproducts,
    doing_working_directory,
    doing_comment,
    doing_source,
    doing_job_pool,
    doing_job_server_aware,
    doing_nothing
  };
  tdoing doing = doing_command;

  // Look for the ALL option.
  bool excludeFromAll = true;
  unsigned int start = 1;
  if (args.size() > 1) {
    if (args[1] == "ALL") {
      excludeFromAll = false;
      start = 2;
    }
  }

  // Parse the rest of the arguments.
  for (unsigned int j = start; j < args.size(); ++j) {
    std::string const& copy = args[j];

    if (copy == "DEPENDS") {
      doing = doing_depends;
    } else if (copy == "BYPRODUCTS") {
      doing = doing_byproducts;
    } else if (copy == "WORKING_DIRECTORY") {
      doing = doing_working_directory;
    } else if (copy == "VERBATIM") {
      doing = doing_nothing;
      verbatim = true;
    } else if (copy == "USES_TERMINAL") {
      doing = doing_nothing;
      uses_terminal = true;
    } else if (copy == "COMMAND_EXPAND_LISTS") {
      doing = doing_nothing;
      command_expand_lists = true;
    } else if (copy == "COMMENT") {
      doing = doing_comment;
    } else if (copy == "JOB_POOL") {
      doing = doing_job_pool;
    } else if (copy == "JOB_SERVER_AWARE") {
      doing = doing_job_server_aware;
    } else if (copy == "COMMAND") {
      doing = doing_command;

      // Save the current command before starting the next command.
      if (!currentLine.empty()) {
        commandLines.push_back(currentLine);
        currentLine.clear();
      }
    } else if (copy == "SOURCES") {
      doing = doing_source;
    } else {
      switch (doing) {
        case doing_working_directory:
          working_directory = copy;
          break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_byproducts: {
          std::string filename;
          if (!cmSystemTools::FileIsFullPath(copy) &&
              cmGeneratorExpression::Find(copy) != 0) {
            filename = cmStrCat(mf.GetCurrentBinaryDirectory(), '/');
          }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          if (cmSystemTools::FileIsFullPath(filename)) {
            filename = cmSystemTools::CollapseFullPath(filename);
          }
          byproducts.push_back(filename);
        } break;
        case doing_depends: {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(std::move(dep));
        } break;
        case doing_comment:
          comment_buffer = copy;
          comment = comment_buffer.c_str();
          break;
        case doing_source:
          sources.push_back(copy);
          break;
        case doing_job_pool:
          job_pool = copy;
          break;
        case doing_job_server_aware:
          job_server_aware = copy;
          break;
        default:
          status.SetError("Wrong syntax. Unknown type of argument.");
          return false;
      }
    }
  }

  std::string::size_type pos = targetName.find_first_of("#<>");
  if (pos != std::string::npos) {
    status.SetError(cmStrCat("called with target name containing a \"",
                             targetName[pos],
                             "\".  This character is not allowed."));
    return false;
  }

  // Some requirements on custom target names already exist
  // and have been checked at this point.
  // The following restrictions overlap but depend on policy CMP0037.
  bool nameOk = cmGeneratorExpression::IsValidTargetName(targetName) &&
    !cmGlobalGenerator::IsReservedTarget(targetName);
  if (nameOk) {
    nameOk = targetName.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(targetName, cmStateEnums::UTILITY)) {
    return false;
  }

  // Store the last command line finished.
  if (!currentLine.empty()) {
    commandLines.push_back(currentLine);
    currentLine.clear();
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(targetName, msg, true)) {
      status.SetError(msg);
      return false;
    }
  }

  if (commandLines.empty() && !byproducts.empty()) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "BYPRODUCTS may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && uses_terminal) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "USES_TERMINAL may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && command_expand_lists) {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      "COMMAND_EXPAND_LISTS may not be specified without any COMMAND");
    return true;
  }

  if (uses_terminal && !job_pool.empty()) {
    status.SetError("JOB_POOL is shadowed by USES_TERMINAL.");
    return false;
  }

  // Add the utility target to the makefile.
  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetWorkingDirectory(working_directory.c_str());
  cc->SetByproducts(byproducts);
  cc->SetDepends(depends);
  cc->SetCommandLines(commandLines);
  cc->SetEscapeOldStyle(!verbatim);
  cc->SetComment(comment);
  cc->SetUsesTerminal(uses_terminal);
  cc->SetCommandExpandLists(command_expand_lists);
  cc->SetJobPool(job_pool);
  cc->SetJobserverAware(cmIsOn(job_server_aware));
  cmTarget* target =
    mf.AddUtilityCommand(targetName, excludeFromAll, std::move(cc));

  // Add additional user-specified source files to the target.
  target->AddSources(sources);

  return true;
}